

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectorclock.h
# Opt level: O0

void __thiscall
VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::update
          (VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_> *this,
          TID tid,VC_ID id)

{
  anon_union_8_1_a8a14541_for_iterator_1 aVar1;
  bool bVar2;
  pointer prVar3;
  pair<phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>::iterator,_bool>
  local_68;
  pair<unsigned_int,_unsigned_long> local_50;
  iterator local_40;
  undefined1 local_30 [8];
  iterator it;
  VC_ID id_local;
  VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_> *pVStack_10;
  TID tid_local;
  VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_> *this_local;
  
  it.field_1 = (anon_union_8_1_a8a14541_for_iterator_1)id;
  id_local._4_4_ = tid;
  pVStack_10 = this;
  _local_30 = phmap::container_internal::
              raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
              ::find<unsigned_int>
                        ((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                          *)this,(key_arg<unsigned_int> *)((long)&id_local + 4));
  local_40 = phmap::container_internal::
             raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
             ::end((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                    *)this);
  bVar2 = phmap::container_internal::operator==((iterator *)local_30,&local_40);
  if (bVar2) {
    std::pair<unsigned_int,_unsigned_long>::pair<unsigned_int_&,_unsigned_long_&,_true>
              (&local_50,(uint *)((long)&id_local + 4),(unsigned_long *)&it.field_1);
    phmap::container_internal::
    raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
    ::insert(&local_68,
             (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
              *)this,&local_50);
  }
  else {
    prVar3 = phmap::container_internal::
             raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
             ::iterator::operator->((iterator *)local_30);
    aVar1 = it.field_1;
    if ((slot_type *)prVar3->second < it.field_1.slot_) {
      prVar3 = phmap::container_internal::
               raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
               ::iterator::operator->((iterator *)local_30);
      prVar3->second = (unsigned_long)aVar1;
    }
  }
  return;
}

Assistant:

void update(TID tid, VC_ID id) {
    auto it = vc.find(tid);
    if (it == vc.end()) {
      vc.insert({tid, id});
    } else {
      if (it->second < id) {
        it->second = id;
      }
    }
  }